

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  char *out;
  char *__dest;
  LogMessage *other;
  LogMessage local_70;
  LogFinisher local_31;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (__return_storage_ptr__->_M_dataplus)._M_p;
  __dest = Append2(out,(AlphaNum *)this,a);
  if (b->piece_size_ != 0) {
    memcpy(__dest,b->piece_data_,b->piece_size_);
    __dest = __dest + b->piece_size_;
  }
  if (__dest != out + __return_storage_ptr__->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
               ,0x5d5);
    other = internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  string result;
  result.resize(a.size() + b.size() + c.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}